

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
          *fadexpr)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  Fad<double> *pFVar4;
  double *pdVar5;
  FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *pFVar6;
  double *pdVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  
  pFVar6 = (fadexpr->fadexpr_).right_;
  uVar2 = (((pFVar6->fadexpr_).expr_.fadexpr_.right_)->dx_).num_elts;
  uVar3 = (this->dx_).num_elts;
  if (uVar2 == uVar3) {
    if (uVar2 == 0) goto LAB_014285c4;
    pdVar5 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar2 == 0) {
      if (uVar3 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_014285c4;
    }
    if (uVar3 != 0) {
      pdVar5 = (this->dx_).ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
        pFVar6 = (fadexpr->fadexpr_).right_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar2;
    uVar10 = (ulong)uVar2 * 8;
    uVar8 = 0xffffffffffffffff;
    if (-1 < (int)uVar2) {
      uVar8 = uVar10;
    }
    pdVar5 = (double *)operator_new__(uVar8);
    (this->dx_).ptr_to_data = pdVar5;
    if ((((pFVar6->fadexpr_).expr_.fadexpr_.right_)->dx_).num_elts == 0) {
      if (0 < (int)uVar2) {
        lVar9 = 0;
        do {
          pFVar6 = (fadexpr->fadexpr_).right_;
          pFVar4 = (pFVar6->fadexpr_).expr_.fadexpr_.right_;
          pdVar7 = &pFVar4->defaultVal;
          if ((pFVar4->dx_).num_elts != 0) {
            pdVar7 = (double *)((long)(pFVar4->dx_).ptr_to_data + lVar9);
          }
          dVar1 = (pFVar6->fadexpr_).expr_.fadexpr_.left_.constant_;
          dVar12 = *pdVar7;
          dVar11 = exp(dVar1 * pFVar4->val_);
          *(double *)((long)pdVar5 + lVar9) =
               dVar11 * dVar12 * dVar1 * (fadexpr->fadexpr_).left_.constant_;
          lVar9 = lVar9 + 8;
        } while (uVar10 - lVar9 != 0);
      }
      goto LAB_014285c4;
    }
  }
  if (0 < (int)uVar2) {
    uVar10 = 0;
    do {
      pFVar6 = (fadexpr->fadexpr_).right_;
      pFVar4 = (pFVar6->fadexpr_).expr_.fadexpr_.right_;
      dVar1 = (pFVar6->fadexpr_).expr_.fadexpr_.left_.constant_;
      dVar12 = (pFVar4->dx_).ptr_to_data[uVar10];
      dVar11 = exp(dVar1 * pFVar4->val_);
      pdVar5[uVar10] = dVar11 * dVar12 * dVar1 * (fadexpr->fadexpr_).left_.constant_;
      uVar10 = uVar10 + 1;
    } while (uVar2 != uVar10);
  }
LAB_014285c4:
  dVar1 = (fadexpr->fadexpr_).left_.constant_;
  pFVar6 = (fadexpr->fadexpr_).right_;
  dVar12 = exp((pFVar6->fadexpr_).expr_.fadexpr_.left_.constant_ *
               ((pFVar6->fadexpr_).expr_.fadexpr_.right_)->val_);
  this->val_ = dVar12 * dVar1;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}